

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader_factory.cc
# Opt level: O1

unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
draco::FileReaderFactory::OpenReader(string *file_name)

{
  pointer pp_Var1;
  pointer pcVar2;
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *pvVar3;
  pointer *__ptr;
  pointer pp_Var4;
  bool bVar5;
  
  pvVar3 = (anonymous_namespace)::GetFileReaderOpenFunctions_abi_cxx11_();
  pp_Var4 = (pvVar3->
            super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (pvVar3->
            super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pp_Var4 == pp_Var1;
  if (!bVar5) {
    (**pp_Var4)(file_name);
    pcVar2 = (file_name->_M_dataplus)._M_p;
    while (pcVar2 == (pointer)0x0) {
      pp_Var4 = pp_Var4 + 1;
      (file_name->_M_dataplus)._M_p = (pointer)0x0;
      bVar5 = pp_Var4 == pp_Var1;
      if (bVar5) goto LAB_00111ab2;
      (**pp_Var4)(file_name);
      pcVar2 = (file_name->_M_dataplus)._M_p;
    }
    if (!bVar5) {
      return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
                )file_name;
    }
  }
LAB_00111ab2:
  (file_name->_M_dataplus)._M_p = (pointer)0x0;
  return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )file_name;
}

Assistant:

std::unique_ptr<FileReaderInterface> FileReaderFactory::OpenReader(
    const std::string &file_name) {
  for (auto open_function : *GetFileReaderOpenFunctions()) {
    auto reader = open_function(file_name);
    if (reader == nullptr) {
      continue;
    }
    return reader;
  }
  return nullptr;
}